

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void append_reverse_ulong(xmlZMemBuff *buff,unsigned_long data)

{
  int local_1c;
  unsigned_long uStack_18;
  int idx;
  unsigned_long data_local;
  xmlZMemBuff *buff_local;
  
  if (buff != (xmlZMemBuff *)0x0) {
    uStack_18 = data;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      *(buff->zctrl).next_out = (Bytef)uStack_18;
      uStack_18 = uStack_18 >> 8;
      (buff->zctrl).next_out = (buff->zctrl).next_out + 1;
    }
  }
  return;
}

Assistant:

static void
append_reverse_ulong( xmlZMemBuff * buff, unsigned long data ) {

    int		idx;

    if ( buff == NULL )
	return;

    /*
    **  This is plagiarized from putLong in gzio.c (zlib source) where
    **  the number "4" is hardcoded.  If zlib is ever patched to
    **  support 64 bit file sizes, this code would need to be patched
    **  as well.
    */

    for ( idx = 0; idx < 4; idx++ ) {
	*buff->zctrl.next_out = ( data & 0xff );
	data >>= 8;
	buff->zctrl.next_out++;
    }

    return;
}